

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

void mpi_mul_hlp(size_t i,mbedtls_mpi_uint *s,mbedtls_mpi_uint *d,mbedtls_mpi_uint b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ulong uVar76;
  ulong uVar77;
  ulong *puVar78;
  bool bVar79;
  
  uVar77 = 0;
  if (0xf < i) {
    do {
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar77;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *s;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = b;
      auVar51 = auVar1 * auVar26 + auVar51;
      uVar76 = auVar51._0_8_;
      uVar77 = *d;
      *d = *d + uVar76;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = auVar51._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = s[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = b;
      auVar52 = auVar2 * auVar27 + auVar52;
      uVar76 = auVar52._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = auVar52._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = s[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = b;
      auVar53 = auVar3 * auVar28 + auVar53;
      uVar76 = auVar53._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auVar53._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 3;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = s[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = b;
      auVar54 = auVar4 * auVar29 + auVar54;
      uVar76 = auVar54._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = auVar54._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 4;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = s[4];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = b;
      auVar55 = auVar5 * auVar30 + auVar55;
      uVar76 = auVar55._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = auVar55._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 5;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = s[5];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = b;
      auVar56 = auVar6 * auVar31 + auVar56;
      uVar76 = auVar56._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = auVar56._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 6;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = s[6];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = b;
      auVar57 = auVar7 * auVar32 + auVar57;
      uVar76 = auVar57._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = auVar57._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 7;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = s[7];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = b;
      auVar58 = auVar8 * auVar33 + auVar58;
      uVar76 = auVar58._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = auVar58._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 8;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = s[8];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = b;
      auVar59 = auVar9 * auVar34 + auVar59;
      uVar76 = auVar59._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = auVar59._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 9;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = s[9];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = b;
      auVar60 = auVar10 * auVar35 + auVar60;
      uVar76 = auVar60._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = auVar60._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 10;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = s[10];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = b;
      auVar61 = auVar11 * auVar36 + auVar61;
      uVar76 = auVar61._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = auVar61._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 0xb;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = s[0xb];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = b;
      auVar62 = auVar12 * auVar37 + auVar62;
      uVar76 = auVar62._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = auVar62._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 0xc;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = s[0xc];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = b;
      auVar63 = auVar13 * auVar38 + auVar63;
      uVar76 = auVar63._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auVar63._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 0xd;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = s[0xd];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = b;
      auVar64 = auVar14 * auVar39 + auVar64;
      uVar76 = auVar64._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = auVar64._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 0xe;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = s[0xe];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = b;
      auVar65 = auVar15 * auVar40 + auVar65;
      uVar76 = auVar65._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = auVar65._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      puVar78 = d + 0xf;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = s[0xf];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = b;
      s = s + 0x10;
      auVar66 = auVar16 * auVar41 + auVar66;
      uVar76 = auVar66._0_8_;
      uVar77 = *puVar78;
      *puVar78 = *puVar78 + uVar76;
      uVar77 = auVar66._8_8_ + (ulong)CARRY8(uVar77,uVar76);
      d = d + 0x10;
      i = i - 0x10;
    } while (0xf < i);
  }
  for (; 7 < i; i = i - 8) {
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar77;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *s;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = b;
    auVar67 = auVar17 * auVar42 + auVar67;
    uVar76 = auVar67._0_8_;
    uVar77 = *d;
    *d = *d + uVar76;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auVar67._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = s[1];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = b;
    auVar68 = auVar18 * auVar43 + auVar68;
    uVar76 = auVar68._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auVar68._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = s[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = b;
    auVar69 = auVar19 * auVar44 + auVar69;
    uVar76 = auVar69._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auVar69._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 3;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = s[3];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = b;
    auVar70 = auVar20 * auVar45 + auVar70;
    uVar76 = auVar70._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auVar70._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 4;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = s[4];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = b;
    auVar71 = auVar21 * auVar46 + auVar71;
    uVar76 = auVar71._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auVar71._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 5;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = s[5];
    auVar47._8_8_ = 0;
    auVar47._0_8_ = b;
    auVar72 = auVar22 * auVar47 + auVar72;
    uVar76 = auVar72._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auVar72._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 6;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = s[6];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = b;
    auVar73 = auVar23 * auVar48 + auVar73;
    uVar76 = auVar73._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auVar73._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    puVar78 = d + 7;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = s[7];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = b;
    s = s + 8;
    auVar74 = auVar24 * auVar49 + auVar74;
    uVar76 = auVar74._0_8_;
    uVar77 = *puVar78;
    *puVar78 = *puVar78 + uVar76;
    uVar77 = auVar74._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    d = d + 8;
  }
  for (; i != 0; i = i - 1) {
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar77;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *s;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = b;
    s = s + 1;
    auVar75 = auVar25 * auVar50 + auVar75;
    uVar76 = auVar75._0_8_;
    uVar77 = *d;
    *d = *d + uVar76;
    uVar77 = auVar75._8_8_ + (ulong)CARRY8(uVar77,uVar76);
    d = d + 1;
  }
  do {
    bVar79 = CARRY8(*d,uVar77);
    *d = *d + uVar77;
    d = d + 1;
    uVar77 = 1;
  } while (bVar79);
  return;
}

Assistant:

__attribute__ ((noinline))
#endif
void mpi_mul_hlp( size_t i, mbedtls_mpi_uint *s, mbedtls_mpi_uint *d, mbedtls_mpi_uint b )
{
    mbedtls_mpi_uint c = 0, t = 0;

#if defined(MULADDC_HUIT)
    for( ; i >= 8; i -= 8 )
    {
        MULADDC_INIT
        MULADDC_HUIT
        MULADDC_STOP
    }

    for( ; i > 0; i-- )
    {
        MULADDC_INIT
        MULADDC_CORE
        MULADDC_STOP
    }
#else /* MULADDC_HUIT */
    for( ; i >= 16; i -= 16 )
    {
        MULADDC_INIT
        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE

        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE
        MULADDC_STOP
    }

    for( ; i >= 8; i -= 8 )
    {
        MULADDC_INIT
        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE

        MULADDC_CORE   MULADDC_CORE
        MULADDC_CORE   MULADDC_CORE
        MULADDC_STOP
    }

    for( ; i > 0; i-- )
    {
        MULADDC_INIT
        MULADDC_CORE
        MULADDC_STOP
    }
#endif /* MULADDC_HUIT */

    t++;

    do {
        *d += c; c = ( *d < c ); d++;
    }
    while( c != 0 );
}